

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall
ON_Brep::IsValidVertexTolerancesAndFlags(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  ON_BrepVertex *pOVar3;
  ON_BrepVertex *vertex;
  ON_TextLog *text_log_local;
  int vertex_index_local;
  ON_Brep *this_local;
  
  if ((vertex_index < 0) ||
     (iVar1 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
     iVar1 <= vertex_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar2 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                        (ulong)(uint)vertex_index,(ulong)uVar2);
    }
    return false;
  }
  pOVar3 = ON_ClassArray<ON_BrepVertex>::operator[]
                     ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,vertex_index);
  if (pOVar3->m_vertex_index != vertex_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_vertex_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar3->m_vertex_index,(ulong)(uint)vertex_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  if (pOVar3->m_tolerance <= 0.0 && pOVar3->m_tolerance != 0.0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_tolerace = %g (should be >= 0.0)\n",pOVar3->m_tolerance);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  return true;
}

Assistant:

bool
ON_Brep::IsValidVertexTolerancesAndFlags( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return false;
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return false;
  }

  if ( vertex.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_tolerace = %g (should be >= 0.0)\n",vertex.m_tolerance);
      text_log->PopIndent();
    }
    return false;
  }

  return true;
}